

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

int __thiscall
luna::Lexer::LexNumberXFractional
          (Lexer *this,TokenDetail *detail,bool integer_part,bool point,
          function<bool_(int)> *is_number_char,function<bool_(int)> *is_exponent)

{
  string *args_1;
  String *pSVar1;
  bool bVar2;
  int iVar3;
  LexException *this_00;
  anon_union_16_2_eed97686_for_String_2 *paVar4;
  char cVar5;
  byte bVar6;
  double dVar7;
  
  args_1 = &this->token_buffer_;
  iVar3 = this->current_;
  bVar6 = 0;
  while( true ) {
    bVar2 = std::function<bool_(int)>::operator()(is_number_char,iVar3);
    cVar5 = (char)args_1;
    if (!bVar2) break;
    std::__cxx11::string::push_back(cVar5);
    iVar3 = Next(this);
    this->current_ = iVar3;
    bVar6 = 1;
  }
  if (((integer_part | bVar6 | ~point) & 1) == 0) {
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar1 = this->module_;
    if ((pSVar1->super_GCObject).field_0x11 == '\0') {
      paVar4 = &pSVar1->field_1;
    }
    else {
      paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
    }
    LexException::LexException<char_const(&)[13]>
              (this_00,paVar4->str_buffer_,this->line_,this->column_,(char (*) [13])"unexpect \'.\'"
              );
  }
  else {
    if ((integer_part || point) || bVar6 != 0) {
      bVar2 = std::function<bool_(int)>::operator()(is_exponent,this->current_);
      if (bVar2) {
        std::__cxx11::string::push_back(cVar5);
        iVar3 = Next(this);
        this->current_ = iVar3;
        if ((iVar3 == 0x2d) || (iVar3 == 0x2b)) {
          std::__cxx11::string::push_back(cVar5);
          iVar3 = Next(this);
          this->current_ = iVar3;
        }
        if (9 < iVar3 - 0x30U) {
          this_00 = (LexException *)__cxa_allocate_exception(0x20);
          pSVar1 = this->module_;
          if ((pSVar1->super_GCObject).field_0x11 == '\0') {
            paVar4 = &pSVar1->field_1;
          }
          else {
            paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
          }
          LexException::LexException<char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
                    (this_00,paVar4->str_buffer_,this->line_,this->column_,
                     (char (*) [24])"expect exponent after \'",args_1,(char (*) [2])0x175ec7);
          goto LAB_0015b19f;
        }
        while (iVar3 - 0x30U < 10) {
          std::__cxx11::string::push_back(cVar5);
          iVar3 = Next(this);
          this->current_ = iVar3;
        }
      }
      dVar7 = strtod((this->token_buffer_)._M_dataplus._M_p,(char **)0x0);
      (detail->field_0).number_ = dVar7;
      detail->token_ = 0x117;
      iVar3 = this->column_;
      detail->line_ = this->line_;
      detail->column_ = iVar3;
      detail->module_ = this->module_;
      return 0x117;
    }
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar1 = this->module_;
    if ((pSVar1->super_GCObject).field_0x11 == '\0') {
      paVar4 = &pSVar1->field_1;
    }
    else {
      paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
    }
    LexException::LexException<char_const(&)[29],std::__cxx11::string&,char_const(&)[2]>
              (this_00,paVar4->str_buffer_,this->line_,this->column_,
               (char (*) [29])"unexpect incomplete number \'",args_1,(char (*) [2])0x175ec7);
  }
LAB_0015b19f:
  __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
}

Assistant:

int Lexer::LexNumberXFractional(TokenDetail *detail,
                                    bool integer_part, bool point,
                                    const std::function<bool (int)> &is_number_char,
                                    const std::function<bool (int)> &is_exponent)
    {
        bool fractional_part = false;
        while (is_number_char(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            fractional_part = true;
        }

        if (point && !integer_part && !fractional_part)
            throw LexException(module_->GetCStr(), line_, column_,
                    "unexpect '.'");
        else if (!point && !integer_part && !fractional_part)
            throw LexException(module_->GetCStr(), line_, column_,
                    "unexpect incomplete number '", token_buffer_, "'");

        if (is_exponent(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            if (current_ == '-' || current_ == '+')
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }

            if (!isdigit(current_))
                throw LexException(module_->GetCStr(), line_, column_,
                        "expect exponent after '", token_buffer_, "'");

            while (isdigit(current_))
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }
        }

        double number = strtod(token_buffer_.c_str(), nullptr);
        RETURN_NUMBER_TOKEN_DETAIL(detail, number);
    }